

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_writer.c
# Opt level: O1

_Bool duckdb_je_buf_writer_init
                (tsdn_t *tsdn,buf_writer_t *buf_writer,write_cb_t *write_cb,void *cbopaque,char *buf
                ,size_t buf_len)

{
  long *plVar1;
  rtree_ctx_cache_elm_t *prVar2;
  undefined8 *puVar3;
  void *pvVar4;
  rtree_leaf_elm_t *prVar5;
  szind_t ind;
  write_cb_t *pwVar6;
  rtree_leaf_elm_t *prVar7;
  ulong uVar8;
  size_t sVar9;
  _Bool _Var10;
  atomic_p_t arena;
  rtree_ctx_cache_elm_t *prVar11;
  rtree_ctx_cache_elm_t *prVar12;
  rtree_leaf_elm_t *prVar13;
  rtree_ctx_t *prVar14;
  uint uVar15;
  bool bVar16;
  rtree_ctx_t local_1b0;
  
  pwVar6 = duckdb_je_malloc_message;
  if (duckdb_je_malloc_message == (write_cb_t *)0x0) {
    pwVar6 = duckdb_je_wrtmessage;
  }
  if (write_cb != (write_cb_t *)0x0) {
    pwVar6 = write_cb;
  }
  buf_writer->write_cb = pwVar6;
  buf_writer->cbopaque = cbopaque;
  if (buf == (char *)0x0) {
    if (buf_len < 0x1001) {
      ind = (szind_t)duckdb_je_sz_size2index_tab[buf_len + 7 >> 3];
    }
    else {
      ind = sz_size2index_compute(buf_len);
    }
    arena.repr = duckdb_je_arenas[0].repr;
    if (duckdb_je_arenas[0].repr == (void *)0x0) {
      arena.repr = (arena_t *)0x0;
    }
    buf = (char *)duckdb_je_arena_malloc_hard
                            (tsdn,(arena_t *)arena.repr,buf_len,ind,false,buf_len < 0x3801);
    _Var10 = true;
    if (buf != (char *)0x0) {
      if (tsdn == (tsdn_t *)0x0) {
        prVar14 = &local_1b0;
        duckdb_je_rtree_ctx_data_init(prVar14);
      }
      else {
        prVar14 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      uVar15 = (uint)((ulong)buf >> 0x1e) & 0xf;
      prVar13 = (rtree_leaf_elm_t *)((ulong)buf & 0xffffffffc0000000);
      uVar8 = (ulong)(uVar15 << 4);
      puVar3 = (undefined8 *)((long)&prVar14->cache[0].leafkey + uVar8);
      prVar7 = *(rtree_leaf_elm_t **)((long)&prVar14->cache[0].leafkey + uVar8);
      if (prVar7 == prVar13) {
        prVar7 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)buf >> 9) & 0x1ffff8) + puVar3[1]);
      }
      else if ((rtree_leaf_elm_t *)prVar14->l2_cache[0].leafkey == prVar13) {
        prVar5 = prVar14->l2_cache[0].leaf;
        prVar14->l2_cache[0].leafkey = (uintptr_t)prVar7;
        prVar14->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
        *puVar3 = prVar13;
        puVar3[1] = prVar5;
        prVar7 = (rtree_leaf_elm_t *)
                 ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)buf >> 9) & 0x1ffff8));
      }
      else {
        prVar11 = prVar14->l2_cache + 1;
        if ((rtree_leaf_elm_t *)prVar14->l2_cache[1].leafkey == prVar13) {
          uVar8 = 0;
          bVar16 = false;
        }
        else {
          uVar8 = 0;
          prVar12 = prVar11;
          do {
            if (uVar8 == 6) {
              bVar16 = true;
              goto LAB_00d02cb7;
            }
            prVar11 = prVar12 + 1;
            uVar8 = uVar8 + 1;
            prVar2 = prVar12 + 1;
            prVar12 = prVar11;
          } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar13);
          bVar16 = 6 < uVar8;
        }
        prVar5 = prVar11->leaf;
        prVar11->leafkey = prVar14->l2_cache[uVar8].leafkey;
        prVar11->leaf = prVar14->l2_cache[uVar8].leaf;
        prVar14->l2_cache[uVar8].leafkey = (uintptr_t)prVar7;
        prVar14->l2_cache[uVar8].leaf = (rtree_leaf_elm_t *)puVar3[1];
        *puVar3 = prVar13;
        puVar3[1] = prVar5;
        prVar7 = (rtree_leaf_elm_t *)
                 ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)buf >> 9) & 0x1ffff8));
LAB_00d02cb7:
        if (bVar16) {
          prVar7 = duckdb_je_rtree_leaf_elm_lookup_hard
                             (tsdn,&duckdb_je_arena_emap_global.rtree,prVar14,(uintptr_t)buf,true,
                              false);
        }
      }
      pvVar4 = duckdb_je_arenas
               [*(uint *)(((long)(prVar7->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
                0xfff].repr;
      if (tsdn == (tsdn_t *)0x0) {
        prVar14 = &local_1b0;
        duckdb_je_rtree_ctx_data_init(prVar14);
      }
      else {
        prVar14 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      uVar8 = (ulong)(uVar15 << 4);
      puVar3 = (undefined8 *)((long)&prVar14->cache[0].leafkey + uVar8);
      prVar7 = *(rtree_leaf_elm_t **)((long)&prVar14->cache[0].leafkey + uVar8);
      if (prVar7 == prVar13) {
        prVar7 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)buf >> 9) & 0x1ffff8) + puVar3[1]);
      }
      else if ((rtree_leaf_elm_t *)prVar14->l2_cache[0].leafkey == prVar13) {
        prVar5 = prVar14->l2_cache[0].leaf;
        prVar14->l2_cache[0].leafkey = (uintptr_t)prVar7;
        prVar14->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
        *puVar3 = prVar13;
        puVar3[1] = prVar5;
        prVar7 = (rtree_leaf_elm_t *)
                 ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)buf >> 9) & 0x1ffff8));
      }
      else {
        prVar11 = prVar14->l2_cache + 1;
        if ((rtree_leaf_elm_t *)prVar14->l2_cache[1].leafkey == prVar13) {
          uVar8 = 0;
          bVar16 = false;
        }
        else {
          uVar8 = 0;
          prVar12 = prVar11;
          do {
            if (uVar8 == 6) {
              bVar16 = true;
              goto LAB_00d02d4f;
            }
            prVar11 = prVar12 + 1;
            uVar8 = uVar8 + 1;
            prVar2 = prVar12 + 1;
            prVar12 = prVar11;
          } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar13);
          bVar16 = 6 < uVar8;
        }
        prVar5 = prVar11->leaf;
        prVar11->leafkey = prVar14->l2_cache[uVar8].leafkey;
        prVar11->leaf = prVar14->l2_cache[uVar8].leaf;
        prVar14->l2_cache[uVar8].leafkey = (uintptr_t)prVar7;
        prVar14->l2_cache[uVar8].leaf = (rtree_leaf_elm_t *)puVar3[1];
        *puVar3 = prVar13;
        puVar3[1] = prVar5;
        prVar7 = (rtree_leaf_elm_t *)
                 ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)buf >> 9) & 0x1ffff8));
LAB_00d02d4f:
        if (bVar16) {
          prVar7 = duckdb_je_rtree_leaf_elm_lookup_hard
                             (tsdn,&duckdb_je_arena_emap_global.rtree,prVar14,(uintptr_t)buf,true,
                              false);
        }
      }
      _Var10 = true;
      LOCK();
      plVar1 = (long *)((long)pvVar4 + 0x48);
      *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[(ulong)(prVar7->le_bits).repr >> 0x30];
      UNLOCK();
    }
  }
  else {
    _Var10 = false;
  }
  buf_writer->buf = buf;
  buf_writer->internal_buf = _Var10;
  sVar9 = buf_len - 1;
  if (buf == (char *)0x0) {
    sVar9 = 0;
  }
  buf_writer->buf_size = sVar9;
  buf_writer->buf_end = 0;
  return buf == (char *)0x0;
}

Assistant:

bool
buf_writer_init(tsdn_t *tsdn, buf_writer_t *buf_writer, write_cb_t *write_cb,
    void *cbopaque, char *buf, size_t buf_len) {
	if (write_cb != NULL) {
		buf_writer->write_cb = write_cb;
	} else {
		buf_writer->write_cb = je_malloc_message != NULL ?
		    je_malloc_message : wrtmessage;
	}
	buf_writer->cbopaque = cbopaque;
	assert(buf_len >= 2);
	if (buf != NULL) {
		buf_writer->buf = buf;
		buf_writer->internal_buf = false;
	} else {
		buf_writer->buf = buf_writer_allocate_internal_buf(tsdn,
		    buf_len);
		buf_writer->internal_buf = true;
	}
	if (buf_writer->buf != NULL) {
		buf_writer->buf_size = buf_len - 1; /* Allowing for '\0'. */
	} else {
		buf_writer->buf_size = 0;
	}
	buf_writer->buf_end = 0;
	buf_writer_assert(buf_writer);
	return buf_writer->buf == NULL;
}